

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall
QDataWidgetMapperPrivate::flipEventFilters
          (QDataWidgetMapperPrivate *this,QAbstractItemDelegate *oldDelegate,
          QAbstractItemDelegate *newDelegate)

{
  bool bVar1;
  long in_FS_OFFSET;
  QWidget *w;
  WidgetMapper *e;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QWidget *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_current = (WidgetMapper *)&DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (WidgetMapper *)
       std::
       vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
       ::begin((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                *)in_stack_ffffffffffffffc0);
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::end((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
         *)in_stack_ffffffffffffffc0);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
                             *)in_stack_ffffffffffffffc0,
                            (__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
         ::operator*(&local_10);
    in_stack_ffffffffffffffb8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x872e27)
    ;
    if (in_stack_ffffffffffffffb8 != (QWidget *)0x0) {
      QObject::removeEventFilter(&in_stack_ffffffffffffffb8->super_QObject);
      QObject::installEventFilter(&in_stack_ffffffffffffffb8->super_QObject);
    }
    __gnu_cxx::
    __normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
    ::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void flipEventFilters(QAbstractItemDelegate *oldDelegate,
                          QAbstractItemDelegate *newDelegate) const
    {
        for (const WidgetMapper &e : widgetMap) {
            QWidget *w = e.widget;
            if (!w)
                continue;
            w->removeEventFilter(oldDelegate);
            w->installEventFilter(newDelegate);
        }
    }